

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

EcsTrigger * trigger_find_or_create(ecs_vector_t **triggers,ecs_entity_t entity)

{
  int32_t iVar1;
  void *pvVar2;
  EcsTrigger *pEVar3;
  EcsTrigger *result;
  EcsTrigger *trigger;
  EcsTrigger *trigger_array;
  int trigger_count;
  int trigger_i;
  ecs_entity_t entity_local;
  ecs_vector_t **triggers_local;
  
  iVar1 = ecs_vector_count(*triggers);
  pvVar2 = _ecs_vector_first(*triggers,0x28,0x10);
  trigger_array._4_4_ = 0;
  while( true ) {
    if (iVar1 <= trigger_array._4_4_) {
      pEVar3 = (EcsTrigger *)_ecs_vector_add(triggers,0x28,0x10);
      return pEVar3;
    }
    pEVar3 = (EcsTrigger *)((long)pvVar2 + (long)trigger_array._4_4_ * 0x28);
    if (pEVar3->self == entity) break;
    trigger_array._4_4_ = trigger_array._4_4_ + 1;
  }
  return pEVar3;
}

Assistant:

static
EcsTrigger* trigger_find_or_create(
    ecs_vector_t **triggers,
    ecs_entity_t entity)
{
    ecs_vector_each(*triggers, EcsTrigger, trigger, {
        if (trigger->self == entity) {
            return trigger;
        }
    });

    EcsTrigger *result = ecs_vector_add(triggers, EcsTrigger);
    return result;
}